

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O0

void embree::UpdateTest::move_mesh(RTCGeometry mesh,size_t numVertices,Vec3fa *pos)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *in_RDX;
  ulong in_RSI;
  undefined8 in_RDI;
  size_t i;
  Vec3ff *vertices;
  vint4 mask;
  undefined8 local_2b8;
  ulong uStack_2b0;
  ulong local_2a0;
  long local_298;
  undefined8 *local_290;
  ulong local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined1 *local_268;
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  ulong uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  ulong uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined4 local_1fc;
  undefined8 *local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  ulong uStack_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 local_198;
  ulong uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_178;
  undefined8 *local_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 *local_158;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 local_f8;
  ulong uStack_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 *local_b0;
  undefined4 local_a4;
  undefined8 *local_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  ulong uStack_60;
  undefined8 local_58;
  ulong uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 *local_38;
  undefined8 *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_290 = in_RDX;
  local_288 = in_RSI;
  local_280 = in_RDI;
  local_298 = rtcGetGeometryBufferData(in_RDI,1,0);
  for (local_2a0 = 0; local_2a0 < local_288; local_2a0 = local_2a0 + 1) {
    local_1f8 = local_290;
    local_1fc = 0;
    local_140 = &local_218;
    local_144 = 0xffffffff;
    local_148 = 0xffffffff;
    local_14c = 0xffffffff;
    local_150 = 0;
    local_11c = 0;
    local_120 = 0xffffffff;
    local_124 = 0xffffffff;
    local_128 = 0xffffffff;
    local_138 = 0xffffffffffffffff;
    uStack_130 = 0xffffffff;
    local_218 = 0xffffffffffffffff;
    uStack_210 = 0xffffffff;
    local_1c8 = 0xffffffffffffffff;
    uStack_1c0 = 0xffffffff;
    local_108 = &local_238;
    local_1e8 = *local_290;
    uStack_1e0 = local_290[1];
    local_1d8 = &local_248;
    local_118 = &local_258;
    local_a4 = 0;
    local_7c = 0;
    local_98 = 0;
    uStack_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_100 = &local_228;
    local_48 = 0xffffffffffffffff;
    uStack_40 = 0xffffffff;
    uStack_f0 = uStack_1e0 & 0xffffffff;
    local_18 = 0xffffffffffffffff;
    uStack_10 = 0xffffffff;
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_e8 = &local_228;
    local_1d0 = &local_228;
    local_260 = (undefined8 *)(local_298 + local_2a0 * 0x10);
    local_1a0 = &local_278;
    uVar1 = *local_260;
    uVar2 = local_260[1];
    local_188._0_4_ = (float)uVar1;
    local_188._4_4_ = (float)((ulong)uVar1 >> 0x20);
    uStack_180._0_4_ = (float)uVar2;
    uStack_180._4_4_ = (float)((ulong)uVar2 >> 0x20);
    local_198._0_4_ = (float)local_1e8;
    local_198._4_4_ = (float)((ulong)local_1e8 >> 0x20);
    uStack_190._0_4_ = (float)uStack_1e0;
    local_168 = (float)local_188 + (float)local_198;
    fStack_164 = local_188._4_4_ + local_198._4_4_;
    fStack_160 = (float)uStack_180 + (float)uStack_190;
    fStack_15c = uStack_180._4_4_ + 0.0;
    local_158 = &local_278;
    local_278 = CONCAT44(fStack_164,local_168);
    uStack_270 = CONCAT44(fStack_15c,fStack_160);
    local_178 = &local_278;
    *local_260 = local_278;
    local_260[1] = uStack_270;
    local_268 = (undefined1 *)&local_2b8;
    local_1f0 = (undefined1 *)&local_2b8;
    local_1b0 = (undefined1 *)&local_2b8;
    local_1a8 = local_260;
    local_198 = local_1e8;
    uStack_190 = uStack_f0;
    local_188 = uVar1;
    uStack_180 = uVar2;
    local_170 = local_260;
    local_110 = local_1d8;
    local_f8 = local_1e8;
    local_e0 = local_118;
    local_d8 = local_1d8;
    local_d0 = local_140;
    local_c8 = local_1c8;
    uStack_c0 = uStack_1c0;
    local_b0 = local_108;
    local_a0 = local_118;
    local_68 = local_1e8;
    uStack_60 = uStack_f0;
    local_58 = local_1e8;
    uStack_50 = uStack_1e0;
    local_38 = local_108;
    local_30 = local_108;
    local_2b8 = local_1e8;
    uStack_2b0 = uStack_f0;
    local_258 = local_28;
    uStack_250 = uStack_20;
    local_248 = local_1e8;
    uStack_240 = uStack_1e0;
    local_238 = local_1c8;
    uStack_230 = uStack_1c0;
    local_228 = local_1e8;
    uStack_220 = uStack_f0;
  }
  rtcUpdateGeometryBuffer(local_280,1,0);
  rtcCommitGeometry(local_280);
  return;
}

Assistant:

static void move_mesh(RTCGeometry mesh, size_t numVertices, Vec3fa& pos) 
    {
      Vec3ff* vertices = (Vec3ff*) rtcGetGeometryBufferData(mesh,RTC_BUFFER_TYPE_VERTEX,0);
      for (size_t i=0; i<numVertices; i++)
        vertices[i] += Vec3ff(pos,0.0f);
      rtcUpdateGeometryBuffer(mesh,RTC_BUFFER_TYPE_VERTEX,0);
      rtcCommitGeometry(mesh);
    }